

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge.hh
# Opt level: O2

edge_const_shared_ptr_t __thiscall tchecker::system::edges_t::edge(edges_t *this,edge_id_t edge_id)

{
  long lVar1;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  edge_const_shared_ptr_t eVar2;
  
  lVar1 = *(long *)CONCAT44(in_register_00000034,edge_id);
  if ((in_RDX & 0xffffffff) <
      (ulong)(((long *)CONCAT44(in_register_00000034,edge_id))[1] - lVar1 >> 4)) {
    std::__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tchecker::system::edge_t,void>
              ((__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2> *)
               (lVar1 + (in_RDX & 0xffffffff) * 0x10));
    eVar2.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = extraout_RDX._M_pi;
    eVar2.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (edge_const_shared_ptr_t)
           eVar2.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("edge_id < _edges.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/system/edge.hh"
                ,0x171,
                "tchecker::system::edge_const_shared_ptr_t tchecker::system::edges_t::edge(tchecker::edge_id_t) const"
               );
}

Assistant:

inline tchecker::system::edge_const_shared_ptr_t edge(tchecker::edge_id_t edge_id) const
  {
    assert(edge_id < _edges.size());
    return _edges[edge_id];
  }